

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall
PeleLM::diffuse_scalar_fj
          (PeleLM *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *S_old,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Rho_old,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *S_new,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Rho_new,int S_comp,
          int num_comp,int Rho_comp,Real prev_time,Real a_time,Real a_be_cn_theta,MultiFab *rho_mid,
          int rho_flag,MultiFab **fluxn,MultiFab **fluxnp1,int fluxComp,MultiFab *delta_rhs,
          int rhsComp,MultiFab *alpha_in,int alpha_in_comp,MultiFab **betan,MultiFab **betanp1,
          int betaComp,Vector<double,_std::allocator<double>_> *a_visc_coef,int a_visc_coef_comp,
          MultiFab *theVolume,MultiFab **theArea,IntVect *cratio,BCRec *bc,Geometry *theGeom,
          bool add_hoop_stress,bool add_old_time_divFlux,
          Vector<int,_std::allocator<int>_> *diffuse_this_comp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *this_00;
  int iVar2;
  pointer ppMVar3;
  void *pvVar4;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *pVVar5;
  int iVar6;
  MPI_Comm MVar7;
  long lVar8;
  MultiFab *pMVar9;
  MultiFab *pMVar10;
  int ntasks;
  string local_7c8;
  string local_7a8;
  Real local_788;
  Real local_780;
  Real local_778;
  int local_770;
  int local_76c;
  IntVect local_768;
  undefined1 local_75c;
  bool local_75b;
  vector<int,_std::allocator<int>_> local_758;
  bool local_740;
  bool local_73f;
  bool local_73e;
  bool local_73d;
  bool local_73c;
  int local_734;
  int allthere;
  int allnull;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_728;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_720;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_718;
  PeleLM *local_710;
  Real local_708;
  Real local_700;
  Real local_6f8;
  int local_6f0;
  int local_6ec;
  ForkJoin fj;
  MultiFab S_old_fine;
  MultiFab Rho_new_fine;
  MultiFab Rho_old_fine;
  MultiFab S_new_fine;
  
  iVar2 = *(int *)(amrex::ParallelContext::frames + 0x10);
  iVar6 = num_comp;
  if (iVar2 < num_comp) {
    iVar6 = iVar2;
  }
  ntasks = 1;
  if (1 < (anonymous_namespace)::num_forkjoin_tasks) {
    ntasks = (anonymous_namespace)::num_forkjoin_tasks;
  }
  if (iVar6 < ntasks) {
    ntasks = iVar6;
  }
  if (ntasks == 1) {
    Diffusion::diffuse_scalar
              ((this->super_NavierStokesBase).diffusion,S_old,Rho_old,S_new,Rho_new,S_comp,num_comp,
               Rho_comp,prev_time,a_time,a_be_cn_theta,rho_mid,rho_flag,fluxn,fluxnp1,fluxComp,
               delta_rhs,rhsComp,alpha_in,alpha_in_comp,betan,betanp1,betaComp,cratio,bc,theGeom,
               add_old_time_divFlux,diffuse_this_comp);
  }
  else {
    local_734 = S_comp;
    local_728 = Rho_new;
    local_720 = Rho_old;
    local_718 = S_new;
    local_710 = this;
    local_708 = prev_time;
    local_700 = a_time;
    local_6f8 = a_be_cn_theta;
    S_old_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ =
         amrex::OutStream();
    S_old_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
         DAT_00756620[-1].m_io_rank;
    this_00 = (ostringstream *)
              &S_old_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
               m_bndryReg.m_typ;
    S_old_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._4_4_ =
         DAT_00756620[-1].comm;
    std::__cxx11::ostringstream::ostringstream(this_00);
    *(undefined8 *)
     ((long)&S_old_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op +
     *(long *)(S_old_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
               _4_8_ + -0x18) + 0xcU) =
         *(undefined8 *)
          (S_old_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ + 8 +
          *(long *)(*(long *)S_old_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray
                             .m_bat._0_8_ + -0x18));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Diffusion: using ",0x11);
    std::ostream::operator<<(this_00,ntasks);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," fork-join tasks for ",0x15);
    std::ostream::operator<<(this_00,num_comp);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," diffusion calls (on a total of ",0x20);
    std::ostream::operator<<(this_00,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ranks)",7);
    std::ios::widen((char)*(undefined8 *)
                           (S_old_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                            m_bat.m_op._4_8_ + -0x18) + (char)this_00);
    std::ostream::put((char)this_00);
    std::ostream::flush();
    amrex::Print::~Print((Print *)&S_old_fine);
    amrex::ForkJoin::ForkJoin(&fj,ntasks);
    iVar2 = local_734;
    fj.flag_verbose = (bool)(anonymous_namespace)::forkjoin_verbose;
    amrex::MultiFab::MultiFab
              (&S_old_fine,
               *(S_old->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start,make_alias,local_734,num_comp);
    amrex::MultiFab::MultiFab
              (&S_new_fine,
               *(local_718->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start,make_alias,iVar2,num_comp);
    pVVar5 = local_728;
    amrex::MultiFab::MultiFab
              (&Rho_old_fine,
               *(local_720->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start,make_alias,Rho_comp,1);
    amrex::MultiFab::MultiFab
              (&Rho_new_fine,
               *(pVVar5->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start,make_alias,Rho_comp,1);
    if ((S_old_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0] < 1) ||
       (S_new_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0] < 1)) {
      amrex::Assert_host("S_old_fine.nGrow() >= 1 && S_new_fine.nGrow() >= 1",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                         ,0xbf0,(char *)0x0);
    }
    paVar1 = &local_7a8.field_2;
    local_7a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"S_old_fine","");
    amrex::ForkJoin::reg_mf(&fj,&S_old_fine,&local_7a8,0,split,in,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
    }
    local_7a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"S_new_fine","");
    amrex::ForkJoin::reg_mf(&fj,&S_new_fine,&local_7a8,0,split,inout,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
    }
    if (rho_flag == 2) {
      if ((Rho_old_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0] < 1) ||
         (Rho_new_fine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0] < 1)) {
        amrex::Assert_host("Rho_old_fine.nGrow() >= 1 && Rho_new_fine.nGrow() >= 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                           ,0xbf4,(char *)0x0);
      }
      local_7a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"Rho_old_fine","");
      amrex::ForkJoin::reg_mf(&fj,&Rho_old_fine,&local_7a8,0,duplicate,in,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
      local_7a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"Rho_new_fine","");
      amrex::ForkJoin::reg_mf(&fj,&Rho_new_fine,&local_7a8,0,duplicate,in,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
    }
    ppMVar3 = (S_old->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar8 = (long)(S_old->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppMVar3;
    if (8 < lVar8) {
      pMVar9 = (MultiFab *)operator_new(0x180);
      amrex::MultiFab::MultiFab(pMVar9,ppMVar3[1],make_alias,local_734,num_comp);
      pMVar10 = (MultiFab *)operator_new(0x180);
      amrex::MultiFab::MultiFab
                (pMVar10,(local_718->
                         super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                         super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[1],make_alias,local_734,num_comp);
      if (((pMVar9->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] < 1) ||
         ((pMVar10->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] < 1)) {
        amrex::Assert_host("S_old_crse->nGrow() >= 1 && S_new_crse->nGrow() >= 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                           ,0xbfe,(char *)0x0);
      }
      local_7a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"S_old_crse","");
      amrex::ForkJoin::reg_mf(&fj,pMVar9,&local_7a8,0,split,in,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
      local_7a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"S_new_crse","");
      amrex::ForkJoin::reg_mf(&fj,pMVar10,&local_7a8,0,split,in,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
      if (rho_flag == 2) {
        pMVar9 = (MultiFab *)operator_new(0x180);
        amrex::MultiFab::MultiFab
                  (pMVar9,(local_720->
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[1],make_alias,Rho_comp,1);
        pMVar10 = (MultiFab *)operator_new(0x180);
        amrex::MultiFab::MultiFab
                  (pMVar10,(local_728->
                           super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                           super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[1],make_alias,Rho_comp,1);
        if (((pMVar9->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] < 1) ||
           ((pMVar10->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] < 1)) {
          amrex::Assert_host("Rho_old_crse->nGrow() >= 1 && Rho_new_crse->nGrow() >= 1",
                             "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                             ,0xc05,(char *)0x0);
        }
        local_7a8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"Rho_old_crse","");
        amrex::ForkJoin::reg_mf(&fj,pMVar9,&local_7a8,0,duplicate,in,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
        local_7a8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"Rho_new_crse","");
        amrex::ForkJoin::reg_mf(&fj,pMVar10,&local_7a8,0,duplicate,in,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (rho_flag == 1) {
      local_7a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"rho_half","");
      amrex::ForkJoin::reg_mf(&fj,rho_mid,&local_7a8,0,duplicate,in,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
    }
    GetVecOfPtrs((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_7c8,fluxn,
                 fluxComp,num_comp);
    local_7a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"fluxn","");
    amrex::ForkJoin::reg_mf_vec
              (&fj,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_7c8,
               &local_7a8,split,inout,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
    }
    pvVar4 = (void *)CONCAT44(local_7c8._M_dataplus._M_p._4_4_,(MPI_Comm)local_7c8._M_dataplus._M_p)
    ;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,local_7c8.field_2._M_allocated_capacity - (long)pvVar4);
    }
    GetVecOfPtrs((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_7c8,fluxnp1
                 ,fluxComp,num_comp);
    local_7a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"fluxnp1","");
    amrex::ForkJoin::reg_mf_vec
              (&fj,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_7c8,
               &local_7a8,split,inout,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
    }
    pvVar4 = (void *)CONCAT44(local_7c8._M_dataplus._M_p._4_4_,(MPI_Comm)local_7c8._M_dataplus._M_p)
    ;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,local_7c8.field_2._M_allocated_capacity - (long)pvVar4);
    }
    if (delta_rhs != (MultiFab *)0x0) {
      if ((delta_rhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp <
          num_comp + rhsComp) {
        amrex::Assert_host("delta_rhs->nComp() >= rhsComp + num_comp",
                           "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                           ,0xc15,(char *)0x0);
      }
      pMVar9 = (MultiFab *)operator_new(0x180);
      amrex::MultiFab::MultiFab(pMVar9,delta_rhs,make_alias,rhsComp,num_comp);
      local_7a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"delta_rhs","");
      amrex::ForkJoin::reg_mf(&fj,pMVar9,&local_7a8,0,split,in,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
    }
    if (alpha_in != (MultiFab *)0x0) {
      if ((alpha_in->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp <
          num_comp + alpha_in_comp) {
        amrex::Assert_host("alpha_in->nComp() >= alpha_in_comp + num_comp",
                           "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                           ,0xc1e,(char *)0x0);
      }
      pMVar9 = (MultiFab *)operator_new(0x180);
      amrex::MultiFab::MultiFab(pMVar9,alpha_in,make_alias,alpha_in_comp,num_comp);
      local_7a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"alpha_in","");
      amrex::ForkJoin::reg_mf(&fj,pMVar9,&local_7a8,0,split,in,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
    }
    Diffusion::checkBeta(betan,&allthere,&allnull);
    iVar2 = allthere;
    if (allthere != 0) {
      GetVecOfPtrs((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                   &local_7c8,betan,betaComp,num_comp);
      local_7a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"betan","");
      amrex::ForkJoin::reg_mf_vec
                (&fj,(Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                     &local_7c8,&local_7a8,split,in,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
      pvVar4 = (void *)CONCAT44(local_7c8._M_dataplus._M_p._4_4_,
                                (MPI_Comm)local_7c8._M_dataplus._M_p);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,local_7c8.field_2._M_allocated_capacity - (long)pvVar4);
      }
    }
    Diffusion::checkBeta(betanp1,&allthere,&allnull);
    if (allthere != 0) {
      GetVecOfPtrs((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                   &local_7c8,betanp1,betaComp,num_comp);
      local_7a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"betanp1","");
      amrex::ForkJoin::reg_mf_vec
                (&fj,(Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                     &local_7c8,&local_7a8,split,in,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
      pvVar4 = (void *)CONCAT44(local_7c8._M_dataplus._M_p._4_4_,
                                (MPI_Comm)local_7c8._M_dataplus._M_p);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,local_7c8.field_2._M_allocated_capacity - (long)pvVar4);
      }
    }
    local_7a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"volume","");
    amrex::ForkJoin::reg_mf(&fj,theVolume,&local_7a8,0,duplicate,in,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
    }
    GetVecOfPtrs((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 &local_7c8,theArea,0,1);
    local_7a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"area","");
    amrex::ForkJoin::reg_mf_vec
              (&fj,(Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                   &local_7c8,&local_7a8,duplicate,in,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
    }
    pvVar4 = (void *)CONCAT44(local_7c8._M_dataplus._M_p._4_4_,(MPI_Comm)local_7c8._M_dataplus._M_p)
    ;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,local_7c8.field_2._M_allocated_capacity - (long)pvVar4);
    }
    local_7a8._M_dataplus._M_p = (pointer)bc;
    local_7a8._M_string_length = (size_type)theGeom;
    local_7a8.field_2._M_allocated_capacity = (size_type)a_visc_coef;
    local_7a8.field_2._8_8_ = local_710;
    local_788 = local_708;
    local_780 = local_700;
    local_778 = local_6f8;
    local_770 = rho_flag;
    local_76c = a_visc_coef_comp;
    local_768.vect._0_8_ = *(undefined8 *)cratio->vect;
    local_768.vect[2] = cratio->vect[2];
    local_75c = add_hoop_stress;
    local_75b = add_old_time_divFlux;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_758,&diffuse_this_comp->super_vector<int,_std::allocator<int>_>);
    local_73f = delta_rhs != (MultiFab *)0x0;
    local_73e = alpha_in != (MultiFab *)0x0;
    local_73d = iVar2 != 0;
    local_73c = allthere != 0;
    fj.flag_invoked = true;
    local_740 = 8 < lVar8;
    amrex::ForkJoin::create_task_output_dir(&fj);
    MVar7 = amrex::ForkJoin::split_tasks(&fj);
    amrex::ForkJoin::copy_data_to_tasks(&fj);
    local_6ec = fj.task_me;
    local_6f0 = 0;
    local_7c8._M_dataplus._M_p._0_4_ = MVar7;
    std::vector<amrex::ParallelContext::Frame,std::allocator<amrex::ParallelContext::Frame>>::
    emplace_back<int&,int&,int&>
              ((vector<amrex::ParallelContext::Frame,std::allocator<amrex::ParallelContext::Frame>>
                *)&amrex::ParallelContext::frames,(int *)&local_7c8,&local_6ec,&local_6f0);
    amrex::ForkJoin::get_io_filename_abi_cxx11_(&local_7c8,&fj,false);
    amrex::ForkJoin::set_task_output_file(&local_7c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_7c8._M_dataplus._M_p._4_4_,(MPI_Comm)local_7c8._M_dataplus._M_p) !=
        &local_7c8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_7c8._M_dataplus._M_p._4_4_,(MPI_Comm)local_7c8._M_dataplus._M_p
                              ),local_7c8.field_2._M_allocated_capacity + 1);
    }
    diffusionFJDriver((PeleLM *)local_7a8.field_2._8_8_,&fj,local_788,local_780,local_778,local_770,
                      (Vector<double,_std::allocator<double>_> *)
                      local_7a8.field_2._M_allocated_capacity,local_76c,&local_768,
                      (BCRec *)local_7a8._M_dataplus._M_p,(Geometry *)local_7a8._M_string_length,
                      false,local_75b,(Vector<int,_std::allocator<int>_> *)&local_758,local_740,
                      local_73f,local_73e,local_73d,local_73c);
    DAT_00756620 = DAT_00756620 + -1;
    amrex::ParallelContext::Frame::~Frame(DAT_00756620);
    amrex::ForkJoin::copy_data_from_tasks(&fj);
    if (local_758.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_758.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_758.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_758.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    amrex::MultiFab::~MultiFab(&Rho_new_fine);
    amrex::MultiFab::~MultiFab(&Rho_old_fine);
    amrex::MultiFab::~MultiFab(&S_new_fine);
    amrex::MultiFab::~MultiFab(&S_old_fine);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fj.task_output_dir._M_dataplus._M_p != &fj.task_output_dir.field_2) {
      operator_delete(fj.task_output_dir._M_dataplus._M_p,
                      fj.task_output_dir.field_2._M_allocated_capacity + 1);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&fj.data._M_h);
    std::
    _Rb_tree<amrex::BoxArray::RefID,_std::pair<const_amrex::BoxArray::RefID,_amrex::Vector<std::unique_ptr<amrex::DistributionMapping,_std::default_delete<amrex::DistributionMapping>_>,_std::allocator<std::unique_ptr<amrex::DistributionMapping,_std::default_delete<amrex::DistributionMapping>_>_>_>_>,_std::_Select1st<std::pair<const_amrex::BoxArray::RefID,_amrex::Vector<std::unique_ptr<amrex::DistributionMapping,_std::default_delete<amrex::DistributionMapping>_>,_std::allocator<std::unique_ptr<amrex::DistributionMapping,_std::default_delete<amrex::DistributionMapping>_>_>_>_>_>,_std::less<amrex::BoxArray::RefID>,_std::allocator<std::pair<const_amrex::BoxArray::RefID,_amrex::Vector<std::unique_ptr<amrex::DistributionMapping,_std::default_delete<amrex::DistributionMapping>_>,_std::allocator<std::unique_ptr<amrex::DistributionMapping,_std::default_delete<amrex::DistributionMapping>_>_>_>_>_>_>
    ::~_Rb_tree(&fj.dms._M_t);
    if (fj.split_bounds.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(fj.split_bounds.super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start,(long)fj.split_bounds.super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage -
                               (long)fj.split_bounds.super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void
PeleLM::diffuse_scalar_fj  (const Vector<MultiFab*>&  S_old,
                            const Vector<MultiFab*>&  Rho_old,
                            Vector<MultiFab*>&        S_new,
                            const Vector<MultiFab*>&  Rho_new,
                            int                       S_comp,
                            int                       num_comp,
                            int                       Rho_comp,
                            Real                      prev_time,
                            Real                      a_time,
                            Real                      a_be_cn_theta,
                            const MultiFab&           rho_mid,
                            int                       rho_flag,
                            MultiFab* const*          fluxn,
                            MultiFab* const*          fluxnp1,
                            int                       fluxComp,
                            MultiFab*                 delta_rhs,
                            int                       rhsComp,
                            const MultiFab*           alpha_in,
                            int                       alpha_in_comp,
                            const MultiFab* const*    betan,
                            const MultiFab* const*    betanp1,
                            int                       betaComp,
                            const Vector<Real>&       a_visc_coef,
                            int                       a_visc_coef_comp,
                            const MultiFab&           theVolume,
                            const MultiFab* const*    theArea,
                            const IntVect&            cratio,
                            const BCRec&              bc,
                            const Geometry&           theGeom,
                            bool                      add_hoop_stress,
                            bool                      add_old_time_divFlux,
                            const amrex::Vector<int>& diffuse_this_comp)
{
  int n_procs = ParallelDescriptor::NProcs();
  int n_tasks_suggest = std::min(num_comp,n_procs);
  int n_tasks = std::min(std::max(1,num_forkjoin_tasks),n_tasks_suggest);

  if (n_tasks == 1)
  {
    diffusion->diffuse_scalar(S_old,Rho_old,S_new,Rho_new,S_comp,num_comp,Rho_comp,
                                  prev_time,a_time,a_be_cn_theta,rho_mid,rho_flag,
                                  fluxn,fluxnp1,fluxComp,delta_rhs,rhsComp,
                                  alpha_in,alpha_in_comp,betan,betanp1,betaComp,
                                  cratio,bc,theGeom,
                                  add_old_time_divFlux,diffuse_this_comp);
  }
  else
  {

    Print() << "Diffusion: using " << n_tasks << " fork-join tasks for "
            << num_comp << " diffusion calls (on a total of " << n_procs << " ranks)" << std::endl;

    ForkJoin fj(n_tasks);
    fj.SetVerbose(forkjoin_verbose);

    MultiFab S_old_fine(*S_old[0], amrex::make_alias, S_comp, num_comp);
    MultiFab S_new_fine(*S_new[0], amrex::make_alias, S_comp, num_comp);
    MultiFab Rho_old_fine(*Rho_old[0], amrex::make_alias, Rho_comp, 1);
    MultiFab Rho_new_fine(*Rho_new[0], amrex::make_alias, Rho_comp, 1);

    const int ng = 1;
    AMREX_ALWAYS_ASSERT(S_old_fine.nGrow() >= 1 && S_new_fine.nGrow() >= 1);
    fj.reg_mf(S_old_fine,  "S_old_fine",  ForkJoin::Strategy::split,    ForkJoin::Intent::in,    ng);
    fj.reg_mf(S_new_fine,  "S_new_fine",  ForkJoin::Strategy::split,    ForkJoin::Intent::inout, ng);
    if (rho_flag == 2) {
      AMREX_ALWAYS_ASSERT(Rho_old_fine.nGrow() >= 1 && Rho_new_fine.nGrow() >= 1);
      fj.reg_mf(Rho_old_fine,"Rho_old_fine",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in, ng);
      fj.reg_mf(Rho_new_fine,"Rho_new_fine",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in, ng);
    }

    bool has_coarse_data = S_old.size() > 1;
    if (has_coarse_data) {
      MultiFab *S_old_crse, *S_new_crse;
      S_old_crse = new MultiFab(*S_old[1], amrex::make_alias, S_comp, num_comp);
      S_new_crse = new MultiFab(*S_new[1], amrex::make_alias, S_comp, num_comp);
      AMREX_ALWAYS_ASSERT(S_old_crse->nGrow() >= 1 && S_new_crse->nGrow() >= 1);
      fj.reg_mf(*S_old_crse,  "S_old_crse",  ForkJoin::Strategy::split,    ForkJoin::Intent::in, ng);
      fj.reg_mf(*S_new_crse,  "S_new_crse",  ForkJoin::Strategy::split,    ForkJoin::Intent::in, ng);
      if (rho_flag == 2) {
        MultiFab *Rho_old_crse, *Rho_new_crse;
        Rho_old_crse = new MultiFab(*Rho_old[1], amrex::make_alias, Rho_comp, 1);
        Rho_new_crse = new MultiFab(*Rho_new[1], amrex::make_alias, Rho_comp, 1);
        AMREX_ALWAYS_ASSERT(Rho_old_crse->nGrow() >= 1 && Rho_new_crse->nGrow() >= 1);
        fj.reg_mf(*Rho_old_crse,"Rho_old_crse",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in, ng);
        fj.reg_mf(*Rho_new_crse,"Rho_new_crse",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in, ng);
      }
    }

    if (rho_flag == 1) {
      fj.reg_mf(rho_mid,"rho_half",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in);
    }

    fj.reg_mf_vec(GetVecOfPtrs(fluxn  ,fluxComp,num_comp),"fluxn",  ForkJoin::Strategy::split,ForkJoin::Intent::inout);
    fj.reg_mf_vec(GetVecOfPtrs(fluxnp1,fluxComp,num_comp),"fluxnp1",ForkJoin::Strategy::split,ForkJoin::Intent::inout);

    bool has_delta_rhs = false;
    if (delta_rhs != 0) {
      MultiFab *Rhs;
      AMREX_ALWAYS_ASSERT(delta_rhs->nComp() >= rhsComp + num_comp);
      Rhs = new MultiFab(*delta_rhs, amrex::make_alias, rhsComp, num_comp);
      fj.reg_mf(*Rhs,"delta_rhs",ForkJoin::Strategy::split,ForkJoin::Intent::in);
      has_delta_rhs = true;
    }

    bool has_alpha_in = false;
    if (alpha_in != 0) {
      MultiFab *Alpha;
      AMREX_ALWAYS_ASSERT(alpha_in->nComp() >= alpha_in_comp + num_comp);
      Alpha = new MultiFab(*alpha_in, amrex::make_alias, alpha_in_comp, num_comp);
      fj.reg_mf(*Alpha,"alpha_in",ForkJoin::Strategy::split,ForkJoin::Intent::in);
      has_alpha_in = true;
    }

    int allnull, allthere;
    Diffusion::checkBeta(betan,   allthere, allnull);
    bool has_betan = false;
    if (allthere) {
      fj.reg_mf_vec(GetVecOfPtrs(betan,  betaComp,num_comp),"betan",  ForkJoin::Strategy::split,ForkJoin::Intent::in);
      has_betan = true;
    }

    Diffusion::checkBeta(betanp1, allthere, allnull);
    bool has_betanp1 = false;
    if (allthere) {
      fj.reg_mf_vec(GetVecOfPtrs(betanp1,betaComp,num_comp),"betanp1",ForkJoin::Strategy::split,ForkJoin::Intent::in);
      has_betanp1 = true;
    }

    fj.reg_mf(theVolume,"volume",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in);
    fj.reg_mf_vec(GetVecOfPtrs(theArea,0,1),"area",ForkJoin::Strategy::duplicate,ForkJoin::Intent::in);

    fj.fork_join(
      [=,&bc,&theGeom,&a_visc_coef] (ForkJoin &f)
      {
        diffusionFJDriver(f,
                          prev_time,
                          a_time,
                          a_be_cn_theta,
                          rho_flag,
                          a_visc_coef,
                          a_visc_coef_comp,
                          cratio,
                          bc,
                          theGeom,
                          add_hoop_stress,
                          add_old_time_divFlux,
                          diffuse_this_comp,
                          has_coarse_data, has_delta_rhs, has_alpha_in, has_betan, has_betanp1);
      }
      );
  }
}